

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_equals
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  t_type *local_260;
  t_type *ttype;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_f8;
  t_field **local_f0;
  byte local_e1;
  const_iterator cStack_e0;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_40);
  poVar4 = std::operator<<(poVar4,"public override bool Equals(object that)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"if (!(that is ");
  type_name_abi_cxx11_(&local_b0,this,&local_20->super_t_type,false);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4," other)) return false;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&fields);
  poVar4 = std::operator<<(poVar4,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff20);
  local_e1 = 1;
  local_f0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_e0 = (const_iterator)local_f0;
  do {
    local_f8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff20,&local_f8);
    ptVar1 = tstruct_local;
    if (!bVar2) {
      if ((local_e1 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)tstruct_local,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_2c0);
        poVar4 = std::operator<<(poVar4,"return true;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2c0);
      }
      t_generator::indent_down((t_generator *)this);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_2e0);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2e0);
      return;
    }
    if ((local_e1 & 1) == 0) {
      std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_138);
      std::operator<<(poVar4,"&& ");
      std::__cxx11::string::~string((string *)&local_138);
    }
    else {
      local_e1 = 0;
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_118);
      std::operator<<(poVar4,"return ");
      std::__cxx11::string::~string((string *)&local_118);
      t_generator::indent_up((t_generator *)this);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff20);
    bVar2 = field_is_required(*pptVar5);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)tstruct_local,"((__isset.");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff20);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      std::__cxx11::string::string((string *)&local_198,(string *)psVar6);
      normalize_name(&local_178,this,&local_198,false);
      get_isset_name(&local_158,this,&local_178);
      poVar4 = std::operator<<(poVar4,(string *)&local_158);
      poVar4 = std::operator<<(poVar4," == other.__isset.");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff20);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      std::__cxx11::string::string((string *)&local_1f8,(string *)psVar6);
      normalize_name(&local_1d8,this,&local_1f8,false);
      get_isset_name(&local_1b8,this,&local_1d8);
      poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
      poVar4 = std::operator<<(poVar4,") && ((!__isset.");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff20);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      std::__cxx11::string::string((string *)&ttype,(string *)psVar6);
      normalize_name(&local_238,this,(string *)&ttype,false);
      get_isset_name(&local_218,this,&local_238);
      poVar4 = std::operator<<(poVar4,(string *)&local_218);
      std::operator<<(poVar4,") || (");
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&ttype);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff20);
    local_260 = t_field::get_type(*pptVar5);
    uVar3 = (*(local_260->super_t_doc)._vptr_t_doc[0xd])();
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(local_260->super_t_doc)._vptr_t_doc[7])();
      if ((uVar3 & 1) != 0) goto LAB_003b4790;
      std::operator<<((ostream *)tstruct_local,"System.Object.Equals(");
    }
    else {
LAB_003b4790:
      std::operator<<((ostream *)tstruct_local,"TCollections.Equals(");
    }
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff20);
    prop_name_abi_cxx11_(&local_280,this,*pptVar5,false);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_280);
    poVar4 = std::operator<<(poVar4,", other.");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff20);
    prop_name_abi_cxx11_(&local_2a0,this,*pptVar5,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_2a0);
    std::operator<<(poVar4,")");
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff20);
    bVar2 = field_is_required(*pptVar5);
    if (!bVar2) {
      std::operator<<((ostream *)tstruct_local,")))");
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff20);
  } while( true );
}

Assistant:

void t_netstd_generator::generate_netstd_struct_equals(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override bool Equals(object that)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << type_name(tstruct,false) << " other)) return false;" << endl
        << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;


    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool first = true;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
            out << indent() << "return ";
            indent_up();
        }
        else
        {
            out << endl;
            out << indent() << "&& ";
        }
        if (!field_is_required((*f_iter)))
        {
            out << "((__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << " == other.__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") && ((!__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") || (";
        }
        t_type* ttype = (*f_iter)->get_type();
        if (ttype->is_container() || ttype->is_binary())
        {
            out << "TCollections.Equals(";
        }
        else
        {
            out << "System.Object.Equals(";
        }
        out << prop_name((*f_iter)) << ", other." << prop_name((*f_iter)) << ")";
        if (!field_is_required((*f_iter)))
        {
            out << ")))";
        }
    }
    if (first)
    {
        out << indent() << "return true;" << endl;
    }
    else
    {
        out << ";" << endl;
        indent_down();
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}